

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>::get
          (AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue::operator=(output,&(this->result).super_ExceptionOrValue);
  if (&this->result != (ExceptionOr<kj::_::Void> *)output) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
    }
    if ((this->result).value.ptr.isSet == true) {
      output[1].exception.ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    KJ_IREQUIRE(!isWaiting());
    output.as<T>() = kj::mv(result);
  }